

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

WallTimer __thiscall
miniros::NodeHandle::createWallTimer
          (NodeHandle *this,WallDuration *period,WallTimerCallback *callback,bool oneshot,
          bool autostart)

{
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  WallTimer WVar1;
  WallTimerOptions ops;
  WallTimerOptions local_78;
  
  WallTimerOptions::WallTimerOptions(&local_78);
  local_78.period.super_DurationBase<miniros::WallDuration> =
       *(DurationBase<miniros::WallDuration> *)&(callback->super__Function_base)._M_functor;
  std::function<void_(const_miniros::WallTimerEvent_&)>::operator=
            (&local_78.callback,
             (function<void_(const_miniros::WallTimerEvent_&)> *)
             CONCAT71(in_register_00000009,oneshot));
  local_78.oneshot = autostart;
  createWallTimer(this,(WallTimerOptions *)period);
  WallTimerOptions::~WallTimerOptions(&local_78);
  WVar1.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  WVar1.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (WallTimer)
         WVar1.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

WallTimer NodeHandle::createWallTimer(WallDuration period, const WallTimerCallback& callback, 
                                      bool oneshot, bool autostart) const
{
  WallTimerOptions ops;
  ops.period = period;
  ops.callback = callback;
  ops.oneshot = oneshot;
  ops.autostart = autostart;
  return createWallTimer(ops);
}